

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_expression.cpp
# Opt level: O2

bool __thiscall duckdb::ParsedExpression::IsWindow(ParsedExpression *this)

{
  bool is_window;
  undefined1 local_29;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = &local_29;
  local_29 = 0;
  local_28._8_8_ = 0;
  local_10 = ::std::
             _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/parser/parsed_expression.cpp:23:46)>
             ::_M_invoke;
  local_18 = ::std::
             _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/parser/parsed_expression.cpp:23:46)>
             ::_M_manager;
  ParsedExpressionIterator::EnumerateChildren
            (this,(function<void_(const_duckdb::ParsedExpression_&)> *)&local_28);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return (bool)local_29;
}

Assistant:

bool ParsedExpression::IsWindow() const {
	bool is_window = false;
	ParsedExpressionIterator::EnumerateChildren(*this,
	                                            [&](const ParsedExpression &child) { is_window |= child.IsWindow(); });
	return is_window;
}